

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall
httplib::Stream::write_format<char_const*,char_const*>
          (Stream *this,char *fmt,char **args,char **args_1)

{
  uint uVar1;
  vector<char,_std::allocator<char>_> glowable_buf;
  char buf [2048];
  allocator_type local_851;
  _Vector_base<char,_std::allocator<char>_> local_850;
  char local_838 [2056];
  
  uVar1 = snprintf(local_838,0x7ff,fmt,*args,*args_1);
  if (0 < (int)uVar1) {
    if (uVar1 < 0x7ff) {
      (*this->_vptr_Stream[3])(this,local_838,(ulong)uVar1);
    }
    else {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_850,0x800,&local_851);
      while( true ) {
        if ((int)uVar1 <
            (int)((long)local_850._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_850._M_impl.super__Vector_impl_data._M_start) + -1) break;
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)&local_850,
                   ((long)local_850._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_850._M_impl.super__Vector_impl_data._M_start) * 2);
        uVar1 = snprintf(local_850._M_impl.super__Vector_impl_data._M_start,
                         (size_t)(local_850._M_impl.super__Vector_impl_data._M_finish +
                                 ~(ulong)local_850._M_impl.super__Vector_impl_data._M_start),fmt,
                         *args,*args_1);
      }
      (*this->_vptr_Stream[3])
                (this,local_850._M_impl.super__Vector_impl_data._M_start,(long)(int)uVar1);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_850);
    }
  }
  return;
}

Assistant:

inline void Stream::write_format(const char* fmt, const Args& ...args)
{
    const auto bufsiz = 2048;
    char buf[bufsiz];

#if defined(_MSC_VER) && _MSC_VER < 1900
    auto n = _snprintf_s(buf, bufsiz, bufsiz - 1, fmt, args...);
#else
    auto n = snprintf(buf, bufsiz - 1, fmt, args...);
#endif
    if (n > 0) {
        if (n >= bufsiz - 1) {
            std::vector<char> glowable_buf(bufsiz);

            while (n >= static_cast<int>(glowable_buf.size() - 1)) {
                glowable_buf.resize(glowable_buf.size() * 2);
#if defined(_MSC_VER) && _MSC_VER < 1900
                n = _snprintf_s(&glowable_buf[0], glowable_buf.size(), glowable_buf.size() - 1, fmt, args...);
#else
                n = snprintf(&glowable_buf[0], glowable_buf.size() - 1, fmt, args...);
#endif
            }
            write(&glowable_buf[0], n);
        } else {
            write(buf, n);
        }
    }
}